

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

char * __thiscall cmState::GetCacheEntryValue(cmState *this,string *key)

{
  cmCacheManager *this_00;
  CacheEntry *pCVar1;
  CacheEntry *e;
  string *key_local;
  cmState *this_local;
  
  this_00 = cmake::GetCacheManager(this->CMakeInstance);
  pCVar1 = cmCacheManager::GetCacheEntry(this_00,key);
  if (pCVar1 == (CacheEntry *)0x0) {
    this_local = (cmState *)0x0;
  }
  else {
    this_local = (cmState *)std::__cxx11::string::c_str();
  }
  return (char *)this_local;
}

Assistant:

const char* cmState::GetCacheEntryValue(std::string const& key) const
{
  cmCacheManager::CacheEntry* e = this->CMakeInstance->GetCacheManager()
             ->GetCacheEntry(key);
  if (!e)
    {
    return 0;
    }
  return e->Value.c_str();
}